

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

MessageAnalysis __thiscall
google::protobuf::compiler::cpp::MessageSCCAnalyzer::GetSCCAnalysis
          (MessageSCCAnalyzer *this,SCC *scc)

{
  Descriptor *this_00;
  uint uVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  FieldOptions_CType FVar5;
  MessageAnalysis MVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  FileDescriptor *file;
  size_type sVar9;
  const_reference ppDVar10;
  FieldDescriptor *this_01;
  FieldOptions *pFVar11;
  Descriptor *descriptor_00;
  SCC *scc_00;
  MessageAnalysis analysis;
  SCC *child;
  FieldDescriptor *field;
  int j;
  Descriptor *descriptor;
  undefined1 uStack_25;
  int i;
  SCC *pSStack_20;
  MessageAnalysis result;
  SCC *scc_local;
  MessageSCCAnalyzer *this_local;
  
  pSStack_20 = scc;
  sVar7 = std::
          map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
          ::count(&this->analysis_cache_,&stack0xffffffffffffffe0);
  if (sVar7 == 0) {
    MessageAnalysis::MessageAnalysis((MessageAnalysis *)&uStack_25);
    file = SCC::GetFile(pSStack_20);
    bVar2 = UsingImplicitWeakFields(file,&this->options_);
    if (bVar2) {
      i._3_1_ = 1;
    }
    for (descriptor._4_4_ = 0;
        sVar9 = std::
                vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ::size(&pSStack_20->descriptors), (ulong)(long)descriptor._4_4_ < sVar9;
        descriptor._4_4_ = descriptor._4_4_ + 1) {
      ppDVar10 = std::
                 vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::operator[](&pSStack_20->descriptors,(long)descriptor._4_4_);
      this_00 = *ppDVar10;
      iVar3 = Descriptor::extension_range_count(this_00);
      if (0 < iVar3) {
        _uStack_25 = CONCAT12(true,_uStack_25);
      }
      for (field._4_4_ = 0; iVar3 = Descriptor::field_count(this_00), field._4_4_ < iVar3;
          field._4_4_ = field._4_4_ + 1) {
        this_01 = Descriptor::field(this_00,field._4_4_);
        bVar2 = FieldDescriptor::is_required(this_01);
        if (bVar2) {
          _uStack_25 = CONCAT13(1,_uStack_25);
        }
        pFVar11 = FieldDescriptor::options(this_01);
        bVar2 = FieldOptions::weak(pFVar11);
        if (bVar2) {
          i._3_1_ = 1;
        }
        TVar4 = FieldDescriptor::type(this_01);
        if (TVar4 == TYPE_STRING) {
LAB_0045e61d:
          pFVar11 = FieldDescriptor::options(this_01);
          FVar5 = FieldOptions::ctype(pFVar11);
          if (FVar5 == FieldOptions_CType_CORD) {
            _uStack_25 = CONCAT11(true,uStack_25);
          }
        }
        else if (TVar4 - TYPE_GROUP < 2) {
          descriptor_00 = FieldDescriptor::message_type(this_01);
          scc_00 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::
                   GetSCC(&this->analyzer_,descriptor_00);
          if (scc_00 == pSStack_20) {
            _uStack_25 = CONCAT31((undefined3)i,1);
          }
          else {
            MVar6 = GetSCCAnalysis(this,scc_00);
            uVar1 = _uStack_25;
            _uStack_25 = CONCAT11((_uStack_25 & 0x100) != 0 || ((uint5)MVar6 & 0x100) != 0,uStack_25
                                 );
            i._2_1_ = SUB41(uVar1,3);
            _uStack_25 = CONCAT12((uVar1 & 0x10000) != 0 || ((uint5)MVar6 & 0x10000) != 0,_uStack_25
                                 );
            bVar2 = ShouldIgnoreRequiredFieldCheck(this_01,&this->options_);
            if (!bVar2) {
              _uStack_25 = CONCAT13((_uStack_25 & 0x1000000) != 0 || ((uint5)MVar6 & 0x1000000) != 0
                                    ,_uStack_25);
            }
            i._3_1_ = (i._3_1_ & 1) != 0 || ((uint5)MVar6 & 0x100000000) != 0;
          }
        }
        else if (TVar4 == TYPE_BYTES) goto LAB_0045e61d;
      }
    }
    pmVar8 = std::
             map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::operator[](&this->analysis_cache_,&stack0xffffffffffffffe0);
    pmVar8->is_recursive = (bool)uStack_25;
    pmVar8->contains_cord = (bool)(undefined1)i;
    pmVar8->contains_extension = (bool)i._1_1_;
    pmVar8->contains_required = (bool)i._2_1_;
    pmVar8->contains_weak = (bool)i._3_1_;
    this_local._3_1_ = pmVar8->is_recursive;
    this_local._4_1_ = pmVar8->contains_cord;
    this_local._5_1_ = pmVar8->contains_extension;
    this_local._6_1_ = pmVar8->contains_required;
    this_local._7_1_ = pmVar8->contains_weak;
  }
  else {
    pmVar8 = std::
             map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::operator[](&this->analysis_cache_,&stack0xffffffffffffffe0);
    this_local._3_1_ = pmVar8->is_recursive;
    this_local._4_1_ = pmVar8->contains_cord;
    this_local._5_1_ = pmVar8->contains_extension;
    this_local._6_1_ = pmVar8->contains_required;
    this_local._7_1_ = pmVar8->contains_weak;
  }
  MVar6.contains_weak = this_local._7_1_;
  MVar6.is_recursive = (bool)this_local._3_1_;
  MVar6.contains_cord = (bool)this_local._4_1_;
  MVar6.contains_extension = (bool)this_local._5_1_;
  MVar6.contains_required = (bool)this_local._6_1_;
  return MVar6;
}

Assistant:

MessageAnalysis MessageSCCAnalyzer::GetSCCAnalysis(const SCC* scc) {
  if (analysis_cache_.count(scc)) return analysis_cache_[scc];
  MessageAnalysis result;
  if (UsingImplicitWeakFields(scc->GetFile(), options_)) {
    result.contains_weak = true;
  }
  for (int i = 0; i < scc->descriptors.size(); i++) {
    const Descriptor* descriptor = scc->descriptors[i];
    if (descriptor->extension_range_count() > 0) {
      result.contains_extension = true;
    }
    for (int j = 0; j < descriptor->field_count(); j++) {
      const FieldDescriptor* field = descriptor->field(j);
      if (field->is_required()) {
        result.contains_required = true;
      }
      if (field->options().weak()) {
        result.contains_weak = true;
      }
      switch (field->type()) {
        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_BYTES: {
          if (field->options().ctype() == FieldOptions::CORD) {
            result.contains_cord = true;
          }
          break;
        }
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE: {
          const SCC* child = analyzer_.GetSCC(field->message_type());
          if (child != scc) {
            MessageAnalysis analysis = GetSCCAnalysis(child);
            result.contains_cord |= analysis.contains_cord;
            result.contains_extension |= analysis.contains_extension;
            if (!ShouldIgnoreRequiredFieldCheck(field, options_)) {
              result.contains_required |= analysis.contains_required;
            }
            result.contains_weak |= analysis.contains_weak;
          } else {
            // This field points back into the same SCC hence the messages
            // in the SCC are recursive. Note if SCC contains more than two
            // nodes it has to be recursive, however this test also works for
            // a single node that is recursive.
            result.is_recursive = true;
          }
          break;
        }
        default:
          break;
      }
    }
  }
  // We deliberately only insert the result here. After we contracted the SCC
  // in the graph, the graph should be a DAG. Hence we shouldn't need to mark
  // nodes visited as we can never return to them. By inserting them here
  // we will go in an infinite loop if the SCC is not correct.
  return analysis_cache_[scc] = result;
}